

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall
Js::DebuggerScope::AreAllPropertiesInDeadZone(DebuggerScope *this,int byteCodeOffset)

{
  bool bVar1;
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  int local_1c;
  DebuggerScope *pDStack_18;
  int byteCodeOffset_local;
  DebuggerScope *this_local;
  
  local_1c = byteCodeOffset;
  pDStack_18 = this;
  bVar1 = HasProperties(this);
  if (bVar1) {
    this_00 = Memory::
              WriteBarrierPtr<JsUtil::List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
              ::operator->(&this->scopeProperties);
    this_local._7_1_ =
         JsUtil::ReadOnlyList<Js::DebuggerScopeProperty,Memory::Recycler,DefaultComparer>::
         All<Js::DebuggerScope::AreAllPropertiesInDeadZone(int)const::__0>
                   ((ReadOnlyList<Js::DebuggerScopeProperty,Memory::Recycler,DefaultComparer> *)
                    this_00,(anon_class_8_1_d4c70e46)&local_1c);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DebuggerScope::AreAllPropertiesInDeadZone(int byteCodeOffset) const
    {
        if (!this->HasProperties())
        {
            return false;
        }

        return this->scopeProperties->All([&](Js::DebuggerScopeProperty& propertyItem)
            {
                return propertyItem.IsInDeadZone(byteCodeOffset);
            });
    }